

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O3

void predict_or_learn_multi<false,false>(nn *n,single_learner *base,example *ec)

{
  polylabel *ppVar1;
  polylabel *ppVar2;
  features *pfVar3;
  bool *pbVar4;
  uchar **ppuVar5;
  uint64_t *puVar6;
  float fVar7;
  int iVar8;
  uint32_t uVar9;
  uint uVar10;
  int iVar11;
  shared_data *psVar12;
  _func_void_shared_data_ptr_float *p_Var13;
  loss_function *plVar14;
  bool *pbVar15;
  polyprediction *ppVar16;
  shared_data *psVar17;
  uint64_t uVar18;
  _func_void_int_string_v_array<char> *p_Var19;
  label_t lVar20;
  wclass *pwVar21;
  size_t sVar22;
  v_array<char> vVar23;
  bool bVar24;
  uint64_t uVar25;
  ostream *poVar26;
  long lVar27;
  features *pfVar28;
  char *pcVar29;
  features *pfVar30;
  uint i;
  vw *all;
  ulong uVar31;
  polyprediction *ppVar32;
  byte bVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  features save_nn_output_namespace;
  ostringstream outputStringStream;
  shared_data sd;
  undefined8 in_stack_fffffffffffffc58;
  example *peVar37;
  example *this;
  example *peVar38;
  undefined4 in_stack_fffffffffffffc68;
  float fVar39;
  float fVar40;
  float fVar41;
  float local_388;
  float local_384;
  undefined1 *local_310;
  undefined1 local_300 [16];
  char local_2f0 [96];
  float local_290;
  undefined1 local_288 [376];
  shared_data local_110;
  
  bVar33 = 0;
  all = n->all;
  iVar8 = all->raw_prediction;
  if (n->finished_setup == false) {
    finish_setup(n,all);
    all = n->all;
  }
  memcpy(&local_110,all->sd,0xe0);
  psVar12 = all->sd;
  all->sd = &local_110;
  if (n->dropout == false) {
    fVar34 = 1.0;
  }
  else {
    fVar34 = 2.0;
  }
  fVar7 = (ec->l).simple.label;
  p_Var13 = n->all->set_minmax;
  plVar14 = n->all->loss;
  pbVar15 = n->dropped_out;
  ppVar16 = n->hidden_units_pred;
  peVar37 = ec;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
  n->all->set_minmax = noop_mm;
  n->all->loss = n->squared_loss;
  psVar17 = n->all->sd;
  fVar41 = psVar17->min_label;
  psVar17->min_label = -3.0;
  psVar17 = n->all->sd;
  fVar39 = psVar17->max_label;
  psVar17->max_label = 3.0;
  uVar18 = (ec->super_example_predict).ft_offset;
  uVar25 = uVar18;
  if (n->multitask == true) {
    (ec->super_example_predict).ft_offset = 0;
    uVar25 = 0;
  }
  (n->hiddenbias).super_example_predict.ft_offset = uVar25;
  if ((0 < iVar8) && (n->k != 0)) {
    uVar31 = 0;
    ppVar32 = ppVar16;
    do {
      if (uVar31 != 0) {
        local_2f0[0] = ' ';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,local_2f0,1);
      }
      poVar26 = std::ostream::_M_insert<unsigned_long>((ulong)local_288);
      local_2f0[0] = ':';
      std::__ostream_insert<char,std::char_traits<char>>(poVar26,local_2f0,1);
      poVar26 = std::ostream::_M_insert<double>((double)ppVar32->scalar);
      local_2f0[0] = ',';
      std::__ostream_insert<char,std::char_traits<char>>(poVar26,local_2f0,1);
      fVar35 = ppVar32->scalar * -2.0 * 1.442695;
      fVar40 = -126.0;
      if (-126.0 <= fVar35) {
        fVar40 = fVar35;
      }
      fVar35 = (fVar40 - (float)(int)fVar40) + (float)(-(uint)(fVar35 < 0.0) & 0x3f800000);
      std::ostream::_M_insert<double>
                ((double)(2.0 / ((float)(long)((fVar35 * -1.4901291 +
                                               27.728024 / (4.8425255 - fVar35) +
                                               fVar40 + 121.274055) * 8388608.0) + 1.0) + -1.0));
      uVar31 = uVar31 + 1;
      ppVar32 = ppVar32 + 1;
    } while (uVar31 < n->k);
  }
  ppVar1 = &peVar37->l;
  n->all->loss = plVar14;
  n->all->set_minmax = p_Var13;
  n->all->sd->min_label = fVar41;
  n->all->sd->max_label = fVar39;
  (peVar37->super_example_predict).ft_offset = uVar18;
  ppVar2 = &(n->output_layer).l;
  pfVar3 = (peVar37->super_example_predict).feature_space + 0x81;
  bVar24 = true;
  local_388 = 0.0;
  local_384 = 0.0;
  fVar41 = 0.0;
  this = peVar37;
  while( true ) {
    (n->output_layer).total_sum_feat_sq = 1.0;
    (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq = 1.0;
    (n->outputweight).super_example_predict.ft_offset = (this->super_example_predict).ft_offset;
    n->all->set_minmax = noop_mm;
    n->all->loss = n->squared_loss;
    psVar17 = n->all->sd;
    fVar39 = psVar17->min_label;
    psVar17->min_label = -1.0;
    psVar17 = n->all->sd;
    fVar40 = psVar17->max_label;
    psVar17->max_label = 1.0;
    if (n->k != 0) {
      uVar31 = 0;
      ppVar32 = ppVar16;
      do {
        fVar35 = 0.0;
        if (pbVar15[uVar31] == false) {
          fVar36 = ppVar32->scalar * -2.0 * 1.442695;
          fVar35 = -126.0;
          if (-126.0 <= fVar36) {
            fVar35 = fVar36;
          }
          fVar36 = (fVar35 - (float)(int)fVar35) + (float)(-(uint)(fVar36 < 0.0) & 0x3f800000);
          fVar35 = (2.0 / ((float)(long)((fVar36 * -1.4901291 +
                                         27.728024 / (4.8425255 - fVar36) + fVar35 + 121.274055) *
                                        8388608.0) + 1.0) + -1.0) * fVar34;
        }
        (n->output_layer).super_example_predict.feature_space[0x81].values._begin[uVar31] = fVar35;
        (n->output_layer).total_sum_feat_sq = (n->output_layer).total_sum_feat_sq + fVar35 * fVar35;
        (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq =
             fVar35 * fVar35 +
             (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
        *(n->outputweight).super_example_predict.feature_space[0x81].indicies._begin =
             (n->output_layer).super_example_predict.feature_space[0x81].indicies._begin[uVar31];
        uVar9 = n->k;
        puVar6 = &(n->outputweight).super_example_predict.ft_offset;
        *puVar6 = *puVar6 + (ulong)(*(int *)(base + 0xe0) * uVar9);
        (**(code **)(base + 0x30))
                  (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),&n->outputweight);
        puVar6 = &(n->outputweight).super_example_predict.ft_offset;
        *puVar6 = *puVar6 - (ulong)(uVar9 * *(int *)(base + 0xe0));
        fVar35 = (n->outputweight).pred.scalar;
        if ((fVar35 == 0.0) && (!NAN(fVar35))) {
          uVar10 = n->k;
          fVar35 = merand48(&n->all->random_state);
          (n->outputweight).l.simple.label = (fVar35 + -0.5) / SQRT((float)uVar10);
          uVar9 = n->k;
          puVar6 = &(n->outputweight).super_example_predict.ft_offset;
          *puVar6 = *puVar6 + (ulong)(*(int *)(base + 0xe0) * uVar9);
          (**(code **)(base + 0x38))
                    (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),&n->outputweight);
          puVar6 = &(n->outputweight).super_example_predict.ft_offset;
          *puVar6 = *puVar6 - (ulong)(uVar9 * *(int *)(base + 0xe0));
          (n->outputweight).l.multi.label = 0x7f7fffff;
        }
        uVar31 = uVar31 + 1;
        ppVar32 = ppVar32 + 1;
      } while (uVar31 < n->k);
    }
    n->all->loss = plVar14;
    n->all->set_minmax = p_Var13;
    n->all->sd->min_label = fVar39;
    n->all->sd->max_label = fVar40;
    if (n->inpass == false) {
      uVar18 = (this->super_example_predict).ft_offset;
      (n->output_layer).super_example_predict.ft_offset = uVar18;
      (n->output_layer).l.cb_eval.event.costs.erase_count =
           (peVar37->l).cb_eval.event.costs.erase_count;
      lVar20 = ppVar1->multi;
      pwVar21 = (peVar37->l).cs.costs._end;
      sVar22 = (peVar37->l).cs.costs.erase_count;
      (n->output_layer).l.cs.costs.end_array = (peVar37->l).cs.costs.end_array;
      (n->output_layer).l.cs.costs.erase_count = sVar22;
      ppVar2->multi = lVar20;
      (n->output_layer).l.cs.costs._end = pwVar21;
      (n->output_layer).weight = this->weight;
      (n->output_layer).partial_prediction = 0.0;
      uVar9 = n->k;
      (n->output_layer).super_example_predict.ft_offset = *(int *)(base + 0xe0) * uVar9 + uVar18;
      (**(code **)(base + 0x30))
                (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),&n->output_layer);
      puVar6 = &(n->output_layer).super_example_predict.ft_offset;
      *puVar6 = *puVar6 - (ulong)(uVar9 * *(int *)(base + 0xe0));
      (peVar37->l).cb_eval.event.costs.erase_count =
           (n->output_layer).l.cb_eval.event.costs.erase_count;
      lVar20 = ppVar2->multi;
      pwVar21 = (n->output_layer).l.cs.costs._end;
      sVar22 = (n->output_layer).l.cs.costs.erase_count;
      (peVar37->l).cs.costs.end_array = (n->output_layer).l.cs.costs.end_array;
      (peVar37->l).cs.costs.erase_count = sVar22;
      ppVar1->multi = lVar20;
      (peVar37->l).cs.costs._end = pwVar21;
    }
    else {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)this,&nn_output_namespace);
      pfVar28 = pfVar3;
      pcVar29 = local_2f0;
      for (lVar27 = 0xd; lVar27 != 0; lVar27 = lVar27 + -1) {
        *(float **)pcVar29 = (pfVar28->values)._begin;
        pfVar28 = (features *)((long)pfVar28 + (ulong)bVar33 * -0x10 + 8);
        pcVar29 = pcVar29 + ((ulong)bVar33 * -2 + 1) * 8;
      }
      pfVar28 = (n->output_layer).super_example_predict.feature_space + 0x81;
      pfVar30 = pfVar3;
      for (lVar27 = 0xc; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pfVar30->values)._begin = (pfVar28->values)._begin;
        pfVar28 = (features *)((long)pfVar28 + (ulong)bVar33 * -0x10 + 8);
        pfVar30 = (features *)((long)pfVar30 + (ulong)bVar33 * -0x10 + 8);
      }
      (peVar37->super_example_predict).feature_space[0x81].sum_feat_sq =
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
      this->total_sum_feat_sq =
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq +
           this->total_sum_feat_sq;
      uVar9 = n->k;
      puVar6 = &(this->super_example_predict).ft_offset;
      *puVar6 = *puVar6 + (ulong)(*(int *)(base + 0xe0) * uVar9);
      peVar38 = this;
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),this);
      puVar6 = &(this->super_example_predict).ft_offset;
      *puVar6 = *puVar6 - (ulong)(uVar9 * *(int *)(base + 0xe0));
      (n->output_layer).partial_prediction = this->partial_prediction;
      (n->output_layer).loss = this->loss;
      this->total_sum_feat_sq =
           this->total_sum_feat_sq -
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
      pcVar29 = local_2f0;
      pfVar28 = pfVar3;
      for (lVar27 = 0xc; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pfVar28->values)._begin = *(float **)pcVar29;
        pcVar29 = pcVar29 + ((ulong)bVar33 * -2 + 1) * 8;
        pfVar28 = (features *)((long)pfVar28 + (ulong)bVar33 * -0x10 + 8);
      }
      (peVar37->super_example_predict).feature_space[0x81].sum_feat_sq = local_290;
      ppuVar5 = &(this->super_example_predict).indices._end;
      *ppuVar5 = *ppuVar5 + -1;
      this = peVar38;
    }
    fVar35 = GD::finalize_prediction(n->all->sd,(n->output_layer).partial_prediction);
    n->prediction = fVar35;
    if (0 < iVar8) {
      local_2f0[0] = ' ';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,local_2f0,1);
      std::ostream::_M_insert<double>((double)(n->output_layer).partial_prediction);
      p_Var19 = n->all->print_text;
      iVar11 = n->all->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar23._end = (char *)this;
      vVar23._begin = (char *)in_stack_fffffffffffffc58;
      vVar23.end_array._0_4_ = in_stack_fffffffffffffc68;
      vVar23.end_array._4_4_ = fVar40;
      vVar23.erase_count._0_4_ = fVar39;
      vVar23.erase_count._4_4_ = fVar41;
      (*p_Var19)(iVar11,(string)peVar37->tag,vVar23);
      if (local_310 != local_300) {
        operator_delete(local_310);
      }
    }
    (ppVar1->simple).label = fVar7;
    if (bVar24) {
      local_384 = n->prediction;
      local_388 = (n->output_layer).partial_prediction;
      fVar41 = (n->output_layer).loss;
    }
    if ((bVar24 & n->dropout) != 1) break;
    bVar24 = false;
    if (n->k != 0) {
      uVar31 = 0;
      do {
        pbVar4 = pbVar15 + uVar31;
        *pbVar4 = (bool)(*pbVar4 ^ 1);
        uVar31 = uVar31 + 1;
      } while (uVar31 < n->k);
      bVar24 = false;
    }
  }
  this->partial_prediction = local_388;
  (this->pred).scalar = local_384;
  this->loss = fVar41;
  n->all->sd = psVar12;
  (*n->all->set_minmax)(n->all->sd,local_110.min_label);
  (*n->all->set_minmax)(n->all->sd,local_110.max_label);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
  std::ios_base::~ios_base((ios_base *)(local_288 + 0x70));
  return;
}

Assistant:

void predict_or_learn_multi(nn& n, single_learner& base, example& ec)
{
  bool shouldOutput = n.all->raw_prediction > 0;
  if (!n.finished_setup)
    finish_setup(n, *(n.all));
  shared_data sd;
  memcpy(&sd, n.all->sd, sizeof(shared_data));
  shared_data* save_sd = n.all->sd;
  n.all->sd = &sd;

  label_data ld = ec.l.simple;
  void (*save_set_minmax)(shared_data*, float) = n.all->set_minmax;
  float save_min_label;
  float save_max_label;
  float dropscale = n.dropout ? 2.0f : 1.0f;
  loss_function* save_loss = n.all->loss;

  polyprediction* hidden_units = n.hidden_units_pred;
  polyprediction* hiddenbias_pred = n.hiddenbias_pred;
  bool* dropped_out = n.dropped_out;

  ostringstream outputStringStream;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = hidden_min_activation;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = hidden_max_activation;

  uint64_t save_ft_offset = ec.ft_offset;

  if (n.multitask)
    ec.ft_offset = 0;

  n.hiddenbias.ft_offset = ec.ft_offset;

  if (recompute_hidden)
  {
    base.multipredict(n.hiddenbias, 0, n.k, hiddenbias_pred, true);

    for (unsigned int i = 0; i < n.k; ++i)
      // avoid saddle point at 0
      if (hiddenbias_pred[i].scalar == 0)
      {
        n.hiddenbias.l.simple.label = (float)(merand48(n.all->random_state) - 0.5);
        base.learn(n.hiddenbias, i);
        n.hiddenbias.l.simple.label = FLT_MAX;
      }

    base.multipredict(ec, 0, n.k, hidden_units, true);

    for (unsigned int i = 0; i < n.k; ++i) dropped_out[i] = (n.dropout && merand48(n.xsubi) < 0.5);

    if (ec.passthrough)
      for (unsigned int i = 0; i < n.k; ++i)
      {
        add_passthrough_feature(ec, i * 2, hiddenbias_pred[i].scalar);
        add_passthrough_feature(ec, i * 2 + 1, hidden_units[i].scalar);
      }
  }

  if (shouldOutput)
    for (unsigned int i = 0; i < n.k; ++i)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << i << ':' << hidden_units[i].scalar << ','
                         << fasttanh(hidden_units[i].scalar);  // TODO: huh, what was going on here?
    }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;
  ec.ft_offset = save_ft_offset;

  bool converse = false;
  float save_partial_prediction = 0;
  float save_final_prediction = 0;
  float save_ec_loss = 0;

CONVERSE:  // That's right, I'm using goto.  So sue me.

  n.output_layer.total_sum_feat_sq = 1;
  n.output_layer.feature_space[nn_output_namespace].sum_feat_sq = 1;

  n.outputweight.ft_offset = ec.ft_offset;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = -1;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = 1;

  for (unsigned int i = 0; i < n.k; ++i)
  {
    float sigmah = (dropped_out[i]) ? 0.0f : dropscale * fasttanh(hidden_units[i].scalar);
    features& out_fs = n.output_layer.feature_space[nn_output_namespace];
    out_fs.values[i] = sigmah;

    n.output_layer.total_sum_feat_sq += sigmah * sigmah;
    out_fs.sum_feat_sq += sigmah * sigmah;

    n.outputweight.feature_space[nn_output_namespace].indicies[0] = out_fs.indicies[i];
    base.predict(n.outputweight, n.k);
    float wf = n.outputweight.pred.scalar;

    // avoid saddle point at 0
    if (wf == 0)
    {
      float sqrtk = sqrt((float)n.k);
      n.outputweight.l.simple.label = (float)(merand48(n.all->random_state) - 0.5) / sqrtk;
      base.update(n.outputweight, n.k);
      n.outputweight.l.simple.label = FLT_MAX;
    }
  }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;

  if (n.inpass)
  {
    // TODO: this is not correct if there is something in the
    // nn_output_namespace but at least it will not leak memory
    // in that case
    ec.indices.push_back(nn_output_namespace);
    features save_nn_output_namespace = ec.feature_space[nn_output_namespace];
    ec.feature_space[nn_output_namespace] = n.output_layer.feature_space[nn_output_namespace];
    ec.total_sum_feat_sq += n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    if (is_learn)
      base.learn(ec, n.k);
    else
      base.predict(ec, n.k);
    n.output_layer.partial_prediction = ec.partial_prediction;
    n.output_layer.loss = ec.loss;
    ec.total_sum_feat_sq -= n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    ec.feature_space[nn_output_namespace].sum_feat_sq = 0;
    ec.feature_space[nn_output_namespace] = save_nn_output_namespace;
    ec.indices.pop();
  }
  else
  {
    n.output_layer.ft_offset = ec.ft_offset;
    n.output_layer.l = ec.l;
    n.output_layer.weight = ec.weight;
    n.output_layer.partial_prediction = 0;
    if (is_learn)
      base.learn(n.output_layer, n.k);
    else
      base.predict(n.output_layer, n.k);
    ec.l = n.output_layer.l;
  }

  n.prediction = GD::finalize_prediction(n.all->sd, n.output_layer.partial_prediction);

  if (shouldOutput)
  {
    outputStringStream << ' ' << n.output_layer.partial_prediction;
    n.all->print_text(n.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (is_learn && n.all->training && ld.label != FLT_MAX)
  {
    float gradient = n.all->loss->first_derivative(n.all->sd, n.prediction, ld.label);

    if (fabs(gradient) > 0)
    {
      n.all->loss = n.squared_loss;
      n.all->set_minmax = noop_mm;
      save_min_label = n.all->sd->min_label;
      n.all->sd->min_label = hidden_min_activation;
      save_max_label = n.all->sd->max_label;
      n.all->sd->max_label = hidden_max_activation;
      save_ft_offset = ec.ft_offset;

      if (n.multitask)
        ec.ft_offset = 0;

      for (unsigned int i = 0; i < n.k; ++i)
      {
        if (!dropped_out[i])
        {
          float sigmah = n.output_layer.feature_space[nn_output_namespace].values[i] / dropscale;
          float sigmahprime = dropscale * (1.0f - sigmah * sigmah);
          n.outputweight.feature_space[nn_output_namespace].indicies[0] =
              n.output_layer.feature_space[nn_output_namespace].indicies[i];
          base.predict(n.outputweight, n.k);
          float nu = n.outputweight.pred.scalar;
          float gradhw = 0.5f * nu * gradient * sigmahprime;

          ec.l.simple.label = GD::finalize_prediction(n.all->sd, hidden_units[i].scalar - gradhw);
          ec.pred.scalar = hidden_units[i].scalar;
          if (ec.l.simple.label != hidden_units[i].scalar)
            base.update(ec, i);
        }
      }

      n.all->loss = save_loss;
      n.all->set_minmax = save_set_minmax;
      n.all->sd->min_label = save_min_label;
      n.all->sd->max_label = save_max_label;
      ec.ft_offset = save_ft_offset;
    }
  }

  ec.l.simple.label = ld.label;

  if (!converse)
  {
    save_partial_prediction = n.output_layer.partial_prediction;
    save_final_prediction = n.prediction;
    save_ec_loss = n.output_layer.loss;
  }

  if (n.dropout && !converse)
  {
    for (unsigned int i = 0; i < n.k; ++i)
    {
      dropped_out[i] = !dropped_out[i];
    }

    converse = true;
    goto CONVERSE;
  }

  ec.partial_prediction = save_partial_prediction;
  ec.pred.scalar = save_final_prediction;
  ec.loss = save_ec_loss;

  n.all->sd = save_sd;
  n.all->set_minmax(n.all->sd, sd.min_label);
  n.all->set_minmax(n.all->sd, sd.max_label);
}